

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_3dVector *
ON_TriangleNormal(ON_3dVector *__return_storage_ptr__,ON_3dPoint *A,ON_3dPoint *B,ON_3dPoint *C)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_40;
  double d;
  double c;
  double b;
  double a;
  ON_3dPoint *C_local;
  ON_3dPoint *B_local;
  ON_3dPoint *A_local;
  
  __return_storage_ptr__->x = C->y * (A->z - B->z) + A->y * (B->z - C->z) + B->y * (C->z - A->z);
  __return_storage_ptr__->y = C->z * (A->x - B->x) + A->z * (B->x - C->x) + B->z * (C->x - A->x);
  __return_storage_ptr__->z = C->x * (A->y - B->y) + A->x * (B->y - C->y) + B->x * (C->y - A->y);
  dVar1 = ABS(__return_storage_ptr__->x);
  dVar2 = ABS(__return_storage_ptr__->y);
  dVar3 = ABS(__return_storage_ptr__->z);
  local_40 = dVar3;
  if (dVar2 <= dVar1) {
    if (dVar3 <= dVar1) {
      local_40 = dVar1;
      if (2.2250738585072014e-308 < dVar1) {
        dVar2 = sqrt((dVar3 / dVar1) * (dVar3 / dVar1) + (dVar2 / dVar1) * (dVar2 / dVar1) + 1.0);
        local_40 = dVar1 * dVar2;
      }
    }
    else if (2.2250738585072014e-308 < dVar3) {
      dVar1 = sqrt((dVar2 / dVar3) * (dVar2 / dVar3) + (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0);
      local_40 = dVar3 * dVar1;
    }
  }
  else if (dVar3 <= dVar2) {
    local_40 = dVar2;
    if (2.2250738585072014e-308 < dVar2) {
      dVar1 = sqrt((dVar1 / dVar2) * (dVar1 / dVar2) + (dVar3 / dVar2) * (dVar3 / dVar2) + 1.0);
      local_40 = dVar2 * dVar1;
    }
  }
  else if (2.2250738585072014e-308 < dVar3) {
    dVar1 = sqrt((dVar2 / dVar3) * (dVar2 / dVar3) + (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0);
    local_40 = dVar3 * dVar1;
  }
  if (0.0 < local_40) {
    __return_storage_ptr__->x = __return_storage_ptr__->x / local_40;
    __return_storage_ptr__->y = __return_storage_ptr__->y / local_40;
    __return_storage_ptr__->z = __return_storage_ptr__->z / local_40;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_TriangleNormal(
        const ON_3dPoint& A,
        const ON_3dPoint& B,
        const ON_3dPoint& C
        )
{
  // N = normal to triangle's plane
  ON_3dVector N;
  double a, b, c, d;
  N.x = A.y*(B.z-C.z) + B.y*(C.z-A.z) + C.y*(A.z-B.z);
  N.y = A.z*(B.x-C.x) + B.z*(C.x-A.x) + C.z*(A.x-B.x);
  N.z = A.x*(B.y-C.y) + B.x*(C.y-A.y) + C.x*(A.y-B.y);

  a = fabs(N.x);
  b = fabs(N.y);
  c = fabs(N.z);
  if ( b > a )
  {
    if ( c > b )
    {
      // c is largest
      if ( c > ON_DBL_MIN )
      {
        a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
      }
      else
      {
        d = c;
      }
    }
    else
    {
      if ( b > ON_DBL_MIN )
      {
        // b is largest
        a /= b; c /= b; d = b*sqrt(1.0 + c*c + a*a);
      }
      else
      {
        d = b;
      }
    }
  }
  else if ( c > a )
  {
    // c is largest
    if ( c > ON_DBL_MIN )
    {
      a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
    }
    else
    {
      d = c;
    }
  }
  else if ( a > ON_DBL_MIN )
  {
    // a is largest
    b /= a; c /= a; d = a*sqrt(1.0 + b*b + c*c);
  }
  else
  {
    d = a;
  }

  if ( d > 0.0 )
  {
    N.x /= d; N.y /= d; N.z /= d;
  }

  return N;
}